

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O0

int cjne_indir_rx_imm_offset(em8051 *aCPU)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int value2;
  int value1;
  int address;
  em8051 *aCPU_local;
  
  uVar3 = (uint)aCPU->mLowerData
                [(int)((aCPU->mCodeMem[(int)(aCPU->mPC & aCPU->mCodeMemSize - 1U)] & 1) +
                      ((int)(aCPU->mSFR[0x50] & 0x18) >> 3) * 8)];
  bVar2 = 0x77;
  bVar1 = aCPU->mCodeMem[(int)(aCPU->mPC + 1U & aCPU->mCodeMemSize - 1U)];
  if (uVar3 < 0x80) {
    bVar2 = aCPU->mLowerData[(int)uVar3];
  }
  else if (aCPU->mUpperData != (uchar *)0x0) {
    bVar2 = aCPU->mUpperData[(int)(uVar3 - 0x80)];
  }
  if (bVar2 < bVar1) {
    aCPU->mSFR[0x50] = aCPU->mSFR[0x50] | 0x80;
  }
  else {
    aCPU->mSFR[0x50] = aCPU->mSFR[0x50] & 0x7f;
  }
  if (bVar2 == bVar1) {
    aCPU->mPC = aCPU->mPC + 3;
  }
  else {
    aCPU->mPC = (char)aCPU->mCodeMem[(int)(aCPU->mPC + 2U & aCPU->mCodeMemSize - 1U)] + 3 +
                aCPU->mPC;
  }
  return 1;
}

Assistant:

static int cjne_indir_rx_imm_offset(struct em8051 *aCPU)
{
    int address = INDIR_RX_ADDRESS;
    int value1 = BAD_VALUE;
    int value2 = OPERAND1;
    if (address > 0x7f)
    {
        if (aCPU->mUpperData)
        {
            value1 = aCPU->mUpperData[address - 0x80];
        }
    }
    else
    {
        value1 = aCPU->mLowerData[address];
    }  

    if (value1 < value2)
    {
        PSW |= PSWMASK_C;
    }
    else
    {
        PSW &= ~PSWMASK_C;
    }

    if (value1 != value2)
    {
        PC += (signed char)OPERAND2 + 3;
    }
    else
    {
        PC += 3;
    }
    return 1;
}